

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>::dx
          (FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_>,_Fad<double>_> *this,
          int i)

{
  double *pdVar1;
  FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_> *in_RDI;
  value_type vVar2;
  value_type vVar3;
  int in_stack_ffffffffffffffcc;
  undefined8 in_stack_ffffffffffffffd8;
  int i_00;
  double dVar4;
  Fad<double> *this_00;
  
  i_00 = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  vVar2 = FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_>::dx(in_RDI,in_stack_ffffffffffffffcc)
  ;
  pdVar1 = Fad<double>::val((Fad<double> *)(in_RDI->fadexpr_).left_.constant_);
  this_00 = (Fad<double> *)*pdVar1;
  pdVar1 = Fad<double>::dx(this_00,i_00);
  dVar4 = *pdVar1;
  vVar3 = FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_>::val
                    ((FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_> *)0x17e8150);
  return vVar2 * (double)this_00 + dVar4 * vVar3;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}